

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_vector_of_tags.hpp
# Opt level: O3

child_tags_list_t * __thiscall
cfgfile::tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>::
children(tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>
         *this)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,cfgfile::string_trait_t>::
      children()::empty == '\0') {
    tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,cfgfile::string_trait_t>::children
              ();
  }
  peVar1 = (this->m_current).
           super___shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*(peVar1->super_tag_no_value_t<cfgfile::string_trait_t>).
              super_tag_t<cfgfile::string_trait_t>._vptr_tag_t[2])();
    return (child_tags_list_t *)CONCAT44(extraout_var,iVar2);
  }
  return &children::empty;
}

Assistant:

const typename tag_t< Trait >::child_tags_list_t & children() const override
	{
		static const typename tag_t< Trait >::child_tags_list_t empty;

		if( m_current )
			return m_current->children();
		else
			return empty;
	}